

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Lms_Man_t * Lms_ManStart(Gia_Man_t *pGia,int nVars,int nCuts,int fFuncOnly,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Lms_Man_t *pLVar5;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  word *pEntry;
  abctime aVar9;
  Gia_Man_t *p_01;
  char *pcVar10;
  Vec_Ptr_t *pVVar11;
  int v;
  Gia_Man_t *pGVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  
  aVar4 = Abc_Clock();
  if (pGia != (Gia_Man_t *)0x0) {
    nVars = pGia->vCis->nSize;
  }
  if (10 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= LMS_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x137,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
  }
  pLVar5 = (Lms_Man_t *)calloc(1,0x40d8);
  pLVar5->nVars = nVars;
  pLVar5->nCuts = nCuts;
  iVar2 = 1 << ((byte)(nVars - 6U) & 0x1f);
  if ((uint)nVars < 7) {
    iVar2 = 1;
  }
  pLVar5->nWords = iVar2;
  pLVar5->fFuncOnly = fFuncOnly;
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar2;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  pLVar5->vTtMem = p;
  iVar2 = Abc_PrimeCudd(10000);
  pVVar6 = Vec_IntStartFull(iVar2);
  p->vTable = pVVar6;
  pVVar6 = Vec_IntAlloc(10000);
  p->vNexts = pVVar6;
  if (fFuncOnly == 0) {
    pVVar6 = (Vec_Int_t *)0x2710;
    p_00 = Vec_IntAlloc(10000);
    pLVar5->vTruthIds = p_00;
    if (pGia == (Gia_Man_t *)0x0) {
      p_01 = Gia_ManStart(10000);
      pLVar5->pGia = p_01;
      pGVar12 = (Gia_Man_t *)0x7;
      pcVar10 = (char *)malloc(7);
      builtin_strncpy(pcVar10,"record",7);
      p_01->pName = pcVar10;
      while( true ) {
        iVar2 = (int)pGVar12;
        bVar16 = nVars == 0;
        nVars = nVars - 1;
        if (bVar16) break;
        pGVar7 = Gia_ManAppendObj(p_01);
        uVar1 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar1 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar1 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
        pVVar6 = p_01->vCis;
        iVar2 = Gia_ObjId(p_01,pGVar7);
        Vec_IntPush(pVVar6,iVar2);
        pGVar12 = p_01;
        Gia_ObjId(p_01,pGVar7);
      }
    }
    else {
      pLVar5->pGia = pGia;
      iVar3 = pGia->vCos->nSize;
      pLVar5->nAdded = iVar3;
      lVar14 = 0;
      lVar13 = 0;
      iVar15 = -1;
      for (v = 0; iVar2 = (int)pVVar6, v < iVar3; v = v + 1) {
        pGVar12 = pGia;
        pGVar7 = Gia_ManCo(pGia,v);
        iVar2 = (int)pGVar12;
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        aVar8 = Abc_Clock();
        pEntry = Gia_ObjComputeTruthTable(pGia,pGVar7);
        aVar9 = Abc_Clock();
        lVar13 = lVar13 + (aVar9 - aVar8);
        pLVar5->timeTruth = lVar13;
        aVar8 = Abc_Clock();
        iVar2 = Vec_MemHashInsert(p,pEntry);
        aVar9 = Abc_Clock();
        lVar14 = lVar14 + (aVar9 - aVar8);
        pLVar5->timeInsert = lVar14;
        if (iVar2 != iVar15 + 1 && iVar2 != iVar15) {
          __assert_fail("Index == Prev || Index == Prev + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                        ,0x15f,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
        }
        pVVar6 = p_00;
        Vec_IntPush(p_00,iVar2);
        iVar3 = pGia->vCos->nSize;
        iVar15 = iVar2;
      }
    }
    pVVar11 = Vec_PtrAlloc(iVar2);
    pLVar5->vNodes = pVVar11;
    pVVar11 = Vec_PtrAlloc(iVar2);
    pLVar5->vLabelsP = pVVar11;
    pVVar6 = Vec_IntAlloc(1000);
    pLVar5->vLabels = pVVar6;
    aVar8 = Abc_Clock();
    pLVar5->timeTotal = aVar8 - aVar4;
  }
  return pLVar5;
}

Assistant:

Lms_Man_t * Lms_ManStart( Gia_Man_t * pGia, int nVars, int nCuts, int fFuncOnly, int fVerbose )
{
    Lms_Man_t * p;
    abctime clk, clk2 = Abc_Clock();
    // if GIA is given, use the number of variables from GIA
    nVars = pGia ? Gia_ManCiNum(pGia) : nVars;
    assert( nVars >= 6 && nVars <= LMS_VAR_MAX );
    // allocate manager
    p = ABC_CALLOC( Lms_Man_t, 1 );
    // parameters
    p->nVars = nVars;
    p->nCuts = nCuts;
    p->nWords = Abc_Truth6WordNum( nVars );
    p->fFuncOnly = fFuncOnly;
    // internal data for library construction
    p->vTtMem = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
//    p->vTtMem2 = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
    Vec_MemHashAlloc( p->vTtMem, 10000 );
//    Vec_MemHashAlloc( p->vTtMem2, 10000 );
    if ( fFuncOnly )
        return p;    
    p->vTruthIds = Vec_IntAlloc( 10000 );
    if ( pGia == NULL )
    {
        int i;
        p->pGia = Gia_ManStart( 10000 );
        p->pGia->pName = Abc_UtilStrsav( "record" );
        for ( i = 0; i < nVars; i++ )
            Gia_ManAppendCi( p->pGia );
    }
    else
    {
        Gia_Obj_t * pObj;
        word * pTruth;
        int i, Index, Prev = -1;
        p->pGia = pGia;
        // populate the manager with subgraphs present in GIA
        p->nAdded = Gia_ManCoNum( p->pGia );
        Gia_ManForEachCo( p->pGia, pObj, i )
        {
            clk = Abc_Clock();
            pTruth = Gia_ObjComputeTruthTable( p->pGia, pObj );
            p->timeTruth += Abc_Clock() - clk;
            clk = Abc_Clock();
            Index = Vec_MemHashInsert( p->vTtMem, pTruth );
            p->timeInsert += Abc_Clock() - clk;
            assert( Index == Prev || Index == Prev + 1 ); // GIA subgraphs should be ordered
            Vec_IntPush( p->vTruthIds, Index );
            Prev = Index;
        }
    }
    // temporaries
    p->vNodes    = Vec_PtrAlloc( 1000 );
    p->vLabelsP  = Vec_PtrAlloc( 1000 );
    p->vLabels   = Vec_IntAlloc( 1000 );
p->timeTotal += Abc_Clock() - clk2;
    return p;    
}